

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O0

RC __thiscall QL_NodeRel::CloseIt(QL_NodeRel *this)

{
  RC RVar1;
  RC local_1c;
  RC rc;
  QL_NodeRel *this_local;
  
  if ((this->useIndex & 1U) == 0) {
    local_1c = RM_FileScan::CloseScan(&this->fs);
    if ((local_1c != 0) ||
       (local_1c = RM_Manager::CloseFile(((this->super_QL_Node).qlm)->rmm,&this->fh), local_1c != 0)
       ) {
      return local_1c;
    }
  }
  else {
    RVar1 = RM_Manager::CloseFile(((this->super_QL_Node).qlm)->rmm,&this->fh);
    if (RVar1 != 0) {
      return RVar1;
    }
    RVar1 = IX_IndexScan::CloseScan(&this->is);
    if (RVar1 != 0) {
      return RVar1;
    }
    local_1c = IX_Manager::CloseIndex(((this->super_QL_Node).qlm)->ixm,&this->ih);
    if (local_1c != 0) {
      return local_1c;
    }
  }
  (this->super_QL_Node).isOpen = false;
  return local_1c;
}

Assistant:

RC QL_NodeRel::CloseIt(){
  RC rc = 0;
  if(useIndex){
    if((rc = qlm.rmm.CloseFile(fh)))
      return (rc);
    if((rc = is.CloseScan()))
      return (rc);
    if((rc = qlm.ixm.CloseIndex(ih )))
      return (rc);
  }
  else{
    if((rc = fs.CloseScan()) || (rc = qlm.rmm.CloseFile(fh)))
      return (rc);
  }
  isOpen = false;
  return (rc);
}